

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

void __thiscall Printer::Printer(Printer *this,DataAttrInfo *attributes_,int attrCount_)

{
  undefined1 auVar1 [16];
  int iVar2;
  DataAttrInfo *pDVar3;
  char **ppcVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  this->attrCount = attrCount_;
  uVar12 = (ulong)attrCount_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar12;
  uVar9 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x44),8) == 0) {
    uVar9 = SUB168(auVar1 * ZEXT816(0x44),0);
  }
  pDVar3 = (DataAttrInfo *)operator_new__(uVar9);
  if (attrCount_ == 0) {
    this->attributes = pDVar3;
    uVar12 = 0;
    attrCount_ = 0;
  }
  else {
    lVar8 = 0;
    do {
      pcVar6 = pDVar3->attrName + lVar8 + 7;
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6[4] = '\0';
      pcVar6[5] = '\0';
      pcVar6[6] = '\0';
      pcVar6[7] = '\0';
      pcVar6[8] = '\0';
      pcVar6[9] = '\0';
      pcVar6[10] = '\0';
      pcVar6[0xb] = '\0';
      pcVar6[0xc] = '\0';
      pcVar6[0xd] = '\0';
      pcVar6[0xe] = '\0';
      pcVar6[0xf] = '\0';
      pcVar6 = pDVar3->relName + lVar8 + 0x10;
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6[4] = '\0';
      pcVar6[5] = '\0';
      pcVar6[6] = '\0';
      pcVar6[7] = '\0';
      pcVar6[8] = '\0';
      pcVar6[9] = '\0';
      pcVar6[10] = '\0';
      pcVar6[0xb] = '\0';
      pcVar6[0xc] = '\0';
      pcVar6[0xd] = '\0';
      pcVar6[0xe] = '\0';
      pcVar6[0xf] = '\0';
      pcVar6 = pDVar3->relName + lVar8;
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6[4] = '\0';
      pcVar6[5] = '\0';
      pcVar6[6] = '\0';
      pcVar6[7] = '\0';
      pcVar6[8] = '\0';
      pcVar6[9] = '\0';
      pcVar6[10] = '\0';
      pcVar6[0xb] = '\0';
      pcVar6[0xc] = '\0';
      pcVar6[0xd] = '\0';
      pcVar6[0xe] = '\0';
      pcVar6[0xf] = '\0';
      (pDVar3->attrName + lVar8 + 0x17)[0] = '\0';
      (pDVar3->attrName + lVar8 + 0x17)[1] = '\0';
      lVar8 = lVar8 + 0x44;
    } while (uVar12 * 0x44 != lVar8);
    this->attributes = pDVar3;
    if (0 < attrCount_) {
      lVar8 = 0;
      lVar11 = 0;
      do {
        DataAttrInfo::operator=
                  ((DataAttrInfo *)(this->attributes->relName + lVar8),
                   (DataAttrInfo *)(attributes_->relName + lVar8));
        lVar11 = lVar11 + 1;
        attrCount_ = this->attrCount;
        uVar12 = (ulong)attrCount_;
        lVar8 = lVar8 + 0x44;
      } while (lVar11 < (long)uVar12);
    }
  }
  this->iCount = 0;
  ppcVar4 = (char **)malloc(uVar12 * 8);
  this->psHeader = ppcVar4;
  uVar9 = 0xffffffffffffffff;
  if (-1 < attrCount_) {
    uVar9 = uVar12 << 2;
  }
  piVar5 = (int *)operator_new__(uVar9);
  this->spaces = piVar5;
  if (0 < attrCount_) {
    lVar8 = 0;
    do {
      pcVar6 = (char *)operator_new__(0x35);
      this->psHeader[lVar8] = pcVar6;
      pcVar6 = this->psHeader[lVar8];
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6[4] = '\0';
      pcVar6[5] = '\0';
      pcVar6[6] = '\0';
      pcVar6[7] = '\0';
      pcVar6[8] = '\0';
      pcVar6[9] = '\0';
      pcVar6[10] = '\0';
      pcVar6[0xb] = '\0';
      pcVar6[0xc] = '\0';
      pcVar6[0xd] = '\0';
      pcVar6[0xe] = '\0';
      pcVar6[0xf] = '\0';
      pcVar6[0x20] = '\0';
      pcVar6[0x21] = '\0';
      pcVar6[0x22] = '\0';
      pcVar6[0x23] = '\0';
      pcVar6[0x24] = '\0';
      pcVar6[0x25] = '\0';
      pcVar6[0x26] = '\0';
      pcVar6[0x27] = '\0';
      pcVar6[0x28] = '\0';
      pcVar6[0x29] = '\0';
      pcVar6[0x2a] = '\0';
      pcVar6[0x2b] = '\0';
      pcVar6[0x2c] = '\0';
      pcVar6[0x2d] = '\0';
      pcVar6[0x2e] = '\0';
      pcVar6[0x2f] = '\0';
      pcVar6[0x10] = '\0';
      pcVar6[0x11] = '\0';
      pcVar6[0x12] = '\0';
      pcVar6[0x13] = '\0';
      pcVar6[0x14] = '\0';
      pcVar6[0x15] = '\0';
      pcVar6[0x16] = '\0';
      pcVar6[0x17] = '\0';
      pcVar6[0x18] = '\0';
      pcVar6[0x19] = '\0';
      pcVar6[0x1a] = '\0';
      pcVar6[0x1b] = '\0';
      pcVar6[0x1c] = '\0';
      pcVar6[0x1d] = '\0';
      pcVar6[0x1e] = '\0';
      pcVar6[0x1f] = '\0';
      pcVar6[0x2d] = '\0';
      pcVar6[0x2e] = '\0';
      pcVar6[0x2f] = '\0';
      pcVar6[0x30] = '\0';
      pcVar6[0x31] = '\0';
      pcVar6[0x32] = '\0';
      pcVar6[0x33] = '\0';
      pcVar6[0x34] = '\0';
      iVar10 = this->attrCount;
      pDVar3 = this->attributes;
      if (0 < (long)iVar10) {
        pcVar6 = pDVar3->attrName;
        lVar11 = 0;
        do {
          if ((lVar8 != lVar11) && (iVar2 = strcmp(pDVar3[lVar8].attrName,pcVar6), iVar2 == 0)) {
            sprintf(this->psHeader[lVar8],"%s.%s",pDVar3 + lVar8,pDVar3[lVar8].attrName);
            goto LAB_0010d2c6;
          }
          lVar11 = lVar11 + 1;
          pcVar6 = pcVar6 + 0x44;
        } while (iVar10 != lVar11);
      }
      strcpy(this->psHeader[lVar8],pDVar3[lVar8].attrName);
LAB_0010d2c6:
      if (this->attributes[lVar8].attrType == STRING) {
        iVar10 = this->attributes[lVar8].attrLength;
        if (0x34 < iVar10) {
          iVar10 = 0x35;
        }
        piVar5 = this->spaces;
        piVar5[lVar8] = iVar10;
        pcVar6 = this->psHeader[lVar8];
      }
      else {
        pcVar6 = this->psHeader[lVar8];
        sVar7 = strlen(pcVar6);
        if (sVar7 < 0xd) {
          sVar7 = 0xc;
        }
        piVar5 = this->spaces;
        iVar10 = (int)sVar7;
        piVar5[lVar8] = iVar10;
      }
      sVar7 = strlen(pcVar6);
      iVar10 = iVar10 - (int)sVar7;
      piVar5[lVar8] = iVar10;
      if (iVar10 < 1) {
        piVar5[lVar8] = 0;
        sVar7 = strlen(pcVar6);
        (pcVar6 + sVar7)[0] = ' ';
        (pcVar6 + sVar7)[1] = '\0';
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->attrCount);
  }
  return;
}

Assistant:

Printer::Printer(const DataAttrInfo *attributes_, const int attrCount_)
{
    attrCount = attrCount_;
    attributes = new DataAttrInfo[attrCount];

    for (int i=0; i < attrCount; i++)
        attributes[i] = attributes_[i];

    // Number of tuples printed
    iCount = 0;

    // Figure out what the header information will look like.  Normally,
    // we can just use the attribute name, but if that appears more than
    // once, then we should use "relation.attribute".

    // this line broke when using CC
    // changing to use malloc and free instead of new and delete
    // psHeader = (char **) new (char *)[attrCount];
    psHeader = (char**)malloc(attrCount * sizeof(char*));

    // Also figure out the number of spaces between each attribute
    spaces = new int[attrCount];

    for (int i=0; i < attrCount; i++ ) {
        // Try to find the attribute in another column
        int bFound = 0;
        psHeader[i] = new char[MAXPRINTSTRING];
        memset(psHeader[i],0,MAXPRINTSTRING);

        for (int j=0; j < attrCount; j++)
            if (j != i &&
                strcmp(attributes[i].attrName,
                       attributes[j].attrName) == 0) {
                bFound = 1;
                break;
            }

        if (bFound)
            sprintf(psHeader[i], "%s.%s",
                    attributes[i].relName, attributes[i].attrName);
        else
            strcpy(psHeader[i], attributes[i].attrName);

        if (attributes[i].attrType==STRING)
            spaces[i] = min(attributes[i].attrLength, MAXPRINTSTRING);
        else
            spaces[i] = max(12, strlen(psHeader[i]));

        // We must subtract out those characters that will be for the
        // header.
        spaces[i] -= strlen(psHeader[i]);

        // If there are negative (or zero) spaces, then insert a single
        // space.
        if (spaces[i] < 1) {
            // The psHeader will give us the space we need
            spaces[i] = 0;
            strcat(psHeader[i]," ");
        }
    }
}